

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void parseOptions(int *argc,char ***argv,string *fileArg,string *fileExt)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  istream *piVar4;
  char *pcVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  string *in_RDX;
  long *in_RSI;
  int *in_RDI;
  string filename;
  char sep;
  stringstream ss;
  string stringBuffer;
  bool boolBuffer;
  int intBuffer;
  CLOParser cop;
  int i;
  int j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  FILE *pFVar9;
  char *in_stack_fffffffffffffc08;
  CLOParser *in_stack_fffffffffffffc10;
  char *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  byte local_391;
  char *local_360;
  char *local_300;
  string *in_stack_fffffffffffffd40;
  undefined5 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4d;
  undefined1 in_stack_fffffffffffffd4e;
  undefined1 in_stack_fffffffffffffd4f;
  undefined1 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd51;
  undefined1 in_stack_fffffffffffffd52;
  undefined1 in_stack_fffffffffffffd53;
  undefined1 in_stack_fffffffffffffd54;
  undefined1 in_stack_fffffffffffffd55;
  undefined1 in_stack_fffffffffffffd56;
  undefined1 in_stack_fffffffffffffd57;
  string local_280 [39];
  byte local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  char local_209;
  stringstream local_208 [224];
  bool *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  CLOParser *in_stack_fffffffffffffee8;
  string *in_stack_ffffffffffffff70;
  char ***in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  string local_68 [35];
  byte local_45;
  uint local_44;
  CLOParser local_40;
  int local_28;
  int local_24;
  string *local_18;
  long *local_10;
  int *local_8;
  
  local_24 = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = 1; local_28 < *local_8; local_28 = local_28 + 1) {
    CLOParser::CLOParser(&local_40,&local_28,*local_8,(char **)*local_10);
    std::__cxx11::string::string(local_68);
    bVar1 = CLOParser::get<int>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                (int *)in_stack_fffffffffffffc00,
                                SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
    if (bVar1) {
      printHelp((int *)CONCAT17(in_stack_fffffffffffffd57,
                                CONCAT16(in_stack_fffffffffffffd56,
                                         CONCAT15(in_stack_fffffffffffffd55,
                                                  CONCAT14(in_stack_fffffffffffffd54,
                                                           CONCAT13(in_stack_fffffffffffffd53,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffd52,
                                                  CONCAT11(in_stack_fffffffffffffd51,
                                                           in_stack_fffffffffffffd50))))))),
                (char ***)
                CONCAT17(in_stack_fffffffffffffd4f,
                         CONCAT16(in_stack_fffffffffffffd4e,
                                  CONCAT15(in_stack_fffffffffffffd4d,in_stack_fffffffffffffd48))),
                in_stack_fffffffffffffd40);
      exit(0);
    }
    bVar1 = CLOParser::get<int>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                (int *)in_stack_fffffffffffffc00,
                                SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
    if (bVar1) {
      printLongHelp(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      exit(0);
    }
    bVar1 = CLOParser::get<int>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                (int *)in_stack_fffffffffffffc00,
                                SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
    if (bVar1) {
      so.nof_solutions = local_44;
    }
    else {
      bVar1 = CLOParser::get<int>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                  (int *)in_stack_fffffffffffffc00,
                                  SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "WARNING: the --time-out flag has recently been changed.");
        poVar6 = std::operator<<(poVar6,
                                 "The time-out is now provided in milliseconds instead of seconds");
        std::operator<<(poVar6,'\n');
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffff80,(int *)&local_44)
        ;
        so.time_out.__r = (rep)in_stack_ffffffffffffff80;
        in_stack_ffffffffffffff80 = (int *)so.time_out.__r;
      }
      else {
        in_stack_fffffffffffffd57 =
             CLOParser::get<int>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                 (int *)in_stack_fffffffffffffc00,
                                 SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
        if ((bool)in_stack_fffffffffffffd57) {
          so.rnd_seed = local_44;
        }
        else {
          in_stack_fffffffffffffd56 =
               CLOParser::getBool(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                  in_stack_fffffffffffffed8);
          if ((bool)in_stack_fffffffffffffd56) {
            so.verbosity = (int)(local_45 & 1);
          }
          else {
            in_stack_fffffffffffffd55 =
                 CLOParser::get<int>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                     (int *)in_stack_fffffffffffffc00,
                                     SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
            if ((bool)in_stack_fffffffffffffd55) {
              so.verbosity = local_44;
            }
            else {
              in_stack_fffffffffffffd54 =
                   CLOParser::getBool(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                      in_stack_fffffffffffffed8);
              if ((bool)in_stack_fffffffffffffd54) {
                so.print_sol = (bool)(local_45 & 1);
              }
              else {
                in_stack_fffffffffffffd53 =
                     CLOParser::get<std::__cxx11::string>
                               (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                in_stack_fffffffffffffc00,
                                SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
                if ((bool)in_stack_fffffffffffffd53) {
                  in_stack_fffffffffffffd52 =
                       std::operator==(in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8);
                  if ((bool)in_stack_fffffffffffffd52) {
                    so.restart_type = CHUFFED_DEFAULT;
                  }
                  else {
                    in_stack_fffffffffffffd51 =
                         std::operator==(in_stack_fffffffffffffc00,(char *)in_stack_fffffffffffffbf8
                                        );
                    if ((bool)in_stack_fffffffffffffd51) {
                      so.restart_type = NONE;
                    }
                    else {
                      in_stack_fffffffffffffd50 =
                           std::operator==(in_stack_fffffffffffffc00,
                                           (char *)in_stack_fffffffffffffbf8);
                      if ((bool)in_stack_fffffffffffffd50) {
                        so.restart_type = CONSTANT;
                      }
                      else {
                        in_stack_fffffffffffffd4f =
                             std::operator==(in_stack_fffffffffffffc00,
                                             (char *)in_stack_fffffffffffffbf8);
                        if ((bool)in_stack_fffffffffffffd4f) {
                          so.restart_type = LINEAR;
                        }
                        else {
                          in_stack_fffffffffffffd4e =
                               std::operator==(in_stack_fffffffffffffc00,
                                               (char *)in_stack_fffffffffffffbf8);
                          if ((bool)in_stack_fffffffffffffd4e) {
                            so.restart_type = LUBY;
                          }
                          else {
                            in_stack_fffffffffffffd4d =
                                 std::operator==(in_stack_fffffffffffffc00,
                                                 (char *)in_stack_fffffffffffffbf8);
                            if ((bool)in_stack_fffffffffffffd4d) {
                              so.restart_type = GEOMETRIC;
                            }
                            else {
                              in_stack_fffffffffffffd40 =
                                   (string *)
                                   std::operator<<((ostream *)&std::cerr,*(char **)*local_10);
                              poVar6 = std::operator<<((ostream *)in_stack_fffffffffffffd40,
                                                       ": Unknown restart strategy ");
                              poVar6 = std::operator<<(poVar6,local_68);
                              std::operator<<(poVar6,". Chuffed will use its default strategy.\n");
                            }
                          }
                        }
                      }
                    }
                  }
                  so.restart_type_override = false;
                }
                else {
                  bVar1 = CLOParser::get<int>(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                              (int *)in_stack_fffffffffffffc00,
                                              SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
                  if (bVar1) {
                    so.restart_scale = local_44;
                    so.restart_scale_override = false;
                  }
                  else {
                    bVar1 = CLOParser::get<std::__cxx11::string>
                                      (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                                       in_stack_fffffffffffffc00,
                                       SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0));
                    if (bVar1) {
                      poVar6 = std::operator<<((ostream *)&std::cerr,
                                               "WARNING: the --restart-base flag has recently been changed."
                                              );
                      poVar6 = std::operator<<(poVar6,
                                               "The old behaviour of \"restart base\" is now implemented by --restart-scale."
                                              );
                      std::operator<<(poVar6,'\n');
                      so.restart_base =
                           std::__cxx11::stod(in_stack_fffffffffffffc00,
                                              (size_t *)in_stack_fffffffffffffbf8);
                      pFVar9 = _stderr;
                      if (so.restart_base < 1.0) {
                        pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                                         ,0x2f);
                        if (pcVar5 == (char *)0x0) {
                          local_300 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                          ;
                        }
                        else {
                          local_300 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                                              ,0x2f);
                          local_300 = local_300 + 1;
                        }
                        fprintf(pFVar9,"%s:%d: ",local_300,0x1ef);
                        fprintf(_stderr,"Illegal restart base. Restart count will converge to zero."
                               );
                        abort();
                      }
                      so.restart_base_override = false;
                    }
                    else {
                      bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0
                                                 ,in_stack_fffffffffffffed8);
                      if (bVar1) {
                        so.toggle_vsids = (bool)(local_45 & 1);
                      }
                      else {
                        bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                   in_stack_fffffffffffffee0,
                                                   in_stack_fffffffffffffed8);
                        if (bVar1) {
                          so.branch_random = (bool)(local_45 & 1);
                        }
                        else {
                          bVar1 = CLOParser::get<int>(in_stack_fffffffffffffc10,
                                                      in_stack_fffffffffffffc08,
                                                      (int *)in_stack_fffffffffffffc00,
                                                      SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38
                                                            ,0));
                          if (bVar1) {
                            so.switch_to_vsids_after = local_44;
                          }
                          else {
                            bVar1 = CLOParser::get<int>(in_stack_fffffffffffffc10,
                                                        in_stack_fffffffffffffc08,
                                                        (int *)in_stack_fffffffffffffc00,
                                                        SUB81((ulong)in_stack_fffffffffffffbf8 >>
                                                              0x38,0));
                            if (bVar1) {
                              so.sat_polarity = local_44;
                            }
                            else {
                              bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                         in_stack_fffffffffffffee0,
                                                         in_stack_fffffffffffffed8);
                              if (bVar1) {
                                so.sbps = (bool)(local_45 & 1);
                              }
                              else {
                                bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                           in_stack_fffffffffffffee0,
                                                           in_stack_fffffffffffffed8);
                                if (bVar1) {
                                  so.prop_fifo = (bool)(local_45 & 1);
                                }
                                else {
                                  bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                             in_stack_fffffffffffffee0,
                                                             in_stack_fffffffffffffed8);
                                  if (bVar1) {
                                    so.disj_edge_find = (bool)(local_45 & 1);
                                  }
                                  else {
                                    bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                               in_stack_fffffffffffffee0,
                                                               in_stack_fffffffffffffed8);
                                    if (bVar1) {
                                      so.disj_set_bp = (bool)(local_45 & 1);
                                    }
                                    else {
                                      bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                                 in_stack_fffffffffffffee0,
                                                                 in_stack_fffffffffffffed8);
                                      if (bVar1) {
                                        so.cumu_global = (bool)(local_45 & 1);
                                      }
                                      else {
                                        bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                                   in_stack_fffffffffffffee0,
                                                                   in_stack_fffffffffffffed8);
                                        if (bVar1) {
                                          so.sat_simplify = (bool)(local_45 & 1);
                                        }
                                        else {
                                          bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                                     in_stack_fffffffffffffee0,
                                                                     in_stack_fffffffffffffed8);
                                          if (bVar1) {
                                            so.fd_simplify = (bool)(local_45 & 1);
                                          }
                                          else {
                                            bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                                       in_stack_fffffffffffffee0,
                                                                       in_stack_fffffffffffffed8);
                                            if (bVar1) {
                                              so.lazy = (bool)(local_45 & 1);
                                            }
                                            else {
                                              bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8,
                                                                         in_stack_fffffffffffffee0,
                                                                         in_stack_fffffffffffffed8);
                                              if (bVar1) {
                                                so.finesse = (bool)(local_45 & 1);
                                              }
                                              else {
                                                bVar1 = CLOParser::getBool(in_stack_fffffffffffffee8
                                                                           ,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                if (bVar1) {
                                                  so.learn = (bool)(local_45 & 1);
                                                }
                                                else {
                                                  bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.vsids = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.sort_learnt_level = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.one_watch = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.exclude_introduced = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.decide_introduced = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.introduced_heuristic = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.use_var_is_introduced = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.print_nodes = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.print_variable_list = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.print_implications = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.send_skipped = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<std::__cxx11::string>
                                                                      (in_stack_fffffffffffffc10,
                                                                       in_stack_fffffffffffffc08,
                                                                       in_stack_fffffffffffffc00,
                                                                       SUB81((ulong)
                                                  in_stack_fffffffffffffbf8 >> 0x38,0));
                                                  if (bVar1) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)&so.filter_domains,local_68
                                                              );
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.learnt_stats = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.learnt_stats_nogood = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.debug = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.exhaustive_activity = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.bin_clause_opt = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.assump_int = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<int>(
                                                  in_stack_fffffffffffffc10,
                                                  in_stack_fffffffffffffc08,
                                                  (int *)in_stack_fffffffffffffc00,
                                                  SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0))
                                                  ;
                                                  if (bVar1) {
                                                    so.eager_limit = local_44;
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<int>(
                                                  in_stack_fffffffffffffc10,
                                                  in_stack_fffffffffffffc08,
                                                  (int *)in_stack_fffffffffffffc00,
                                                  SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0))
                                                  ;
                                                  if (bVar1) {
                                                    so.sat_var_limit = local_44;
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<int>(
                                                  in_stack_fffffffffffffc10,
                                                  in_stack_fffffffffffffc08,
                                                  (int *)in_stack_fffffffffffffc00,
                                                  SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0))
                                                  ;
                                                  if (bVar1) {
                                                    so.nof_learnts = local_44;
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<int>(
                                                  in_stack_fffffffffffffc10,
                                                  in_stack_fffffffffffffc08,
                                                  (int *)in_stack_fffffffffffffc00,
                                                  SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0))
                                                  ;
                                                  if (bVar1) {
                                                    so.learnts_mlimit = local_44;
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.lang_ext_linear = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.mdd = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.mip = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.mip_branch = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.sym_static = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.ldsb = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.ldsbta = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.ldsbad = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::getBool(
                                                  in_stack_fffffffffffffee8,
                                                  in_stack_fffffffffffffee0,
                                                  in_stack_fffffffffffffed8);
                                                  if (bVar1) {
                                                    so.well_founded = (bool)(local_45 & 1);
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<int>(
                                                  in_stack_fffffffffffffc10,
                                                  in_stack_fffffffffffffc08,
                                                  (int *)in_stack_fffffffffffffc00,
                                                  SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0))
                                                  ;
                                                  if (bVar1) {
                                                    so.nof_solutions = 0;
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<int>(
                                                  in_stack_fffffffffffffc10,
                                                  in_stack_fffffffffffffc08,
                                                  (int *)in_stack_fffffffffffffc00,
                                                  SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0))
                                                  ;
                                                  if (bVar1) {
                                                    so.toggle_vsids = true;
                                                    so.restart_scale = 100;
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<int>(
                                                  in_stack_fffffffffffffc10,
                                                  in_stack_fffffffffffffc08,
                                                  (int *)in_stack_fffffffffffffc00,
                                                  SUB81((ulong)in_stack_fffffffffffffbf8 >> 0x38,0))
                                                  ;
                                                  if (bVar1) {
                                                    so.verbosity = 1;
                                                  }
                                                  else {
                                                    bVar1 = CLOParser::get<std::__cxx11::string>
                                                                      (in_stack_fffffffffffffc10,
                                                                       in_stack_fffffffffffffc08,
                                                                       in_stack_fffffffffffffc00,
                                                                       SUB81((ulong)
                                                  in_stack_fffffffffffffbf8 >> 0x38,0));
                                                  if (bVar1) {
                                                    _Var3 = std::operator|(_S_out,_S_in);
                                                    std::__cxx11::stringstream::stringstream
                                                              (local_208,local_68,_Var3);
                                                    piVar4 = (istream *)
                                                             std::istream::operator>>
                                                                       ((istream *)local_208,
                                                                        &so.cpprofiler_id);
                                                    piVar4 = std::operator>>(piVar4,&local_209);
                                                    std::istream::operator>>
                                                              ((istream *)piVar4,&so.cpprofiler_port
                                                              );
                                                    if ((local_209 != ',') ||
                                                       (bVar2 = std::ios::eof(), (bVar2 & 1) == 0))
                                                    {
                                                      pFVar9 = _stderr;
                                                      pcVar5 = strrchr(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                                                  ,0x2f);
                                                  if (pcVar5 == (char *)0x0) {
                                                    local_360 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                                                  ;
                                                  }
                                                  else {
                                                    local_360 = strrchr(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                                                  ,0x2f);
                                                  local_360 = local_360 + 1;
                                                  }
                                                  fprintf(pFVar9,"%s:%d: ",local_360,0x25b);
                                                  fprintf(_stderr,"Invalid value for --cp-profiler."
                                                         );
                                                  abort();
                                                  }
                                                  so.cpprofiler_enabled = true;
                                                  std::__cxx11::stringstream::~stringstream
                                                            (local_208);
                                                  }
                                                  else {
                                                    if (**(char **)(*local_10 + (long)local_28 * 8)
                                                        == '-') {
                                                      poVar6 = std::operator<<((ostream *)&std::cerr
                                                                               ,*(char **)*local_10)
                                                      ;
                                                      poVar6 = std::operator<<(poVar6,
                                                  ": unrecognized option ");
                                                  poVar6 = std::operator<<(poVar6,*(char **)(*
                                                  local_10 + (long)local_28 * 8));
                                                  std::operator<<(poVar6,"\n");
                                                  poVar6 = std::operator<<((ostream *)&std::cerr,
                                                                           *(char **)*local_10);
                                                  std::operator<<(poVar6,
                                                  ": use --help for more information.\n");
                                                  exit(1);
                                                  }
                                                  *(undefined8 *)(*local_10 + (long)local_24 * 8) =
                                                       *(undefined8 *)
                                                        (*local_10 + (long)local_28 * 8);
                                                  local_24 = local_24 + 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_68);
  }
  *local_8 = local_24;
  if (local_18 != (string *)0x0) {
    if (*local_8 == 2) {
      pcVar5 = *(char **)(*local_10 + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,pcVar5,&local_231);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        uVar7 = std::__cxx11::string::size();
        lVar8 = std::__cxx11::string::size();
        local_259 = 0;
        local_391 = 1;
        if (lVar8 + 1U < uVar7) {
          std::__cxx11::string::size();
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_258,(ulong)local_230);
          local_259 = 1;
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                         in_stack_fffffffffffffc40);
          local_391 = std::operator!=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
          std::__cxx11::string::~string(local_280);
        }
        if ((local_259 & 1) != 0) {
          std::__cxx11::string::~string(local_258);
        }
        if ((local_391 & 1) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,*(char **)*local_10);
          poVar6 = std::operator<<(poVar6,": cannot handle file extension for ");
          poVar6 = std::operator<<(poVar6,local_230);
          std::operator<<(poVar6,"\n");
          poVar6 = std::operator<<((ostream *)&std::cerr,*(char **)*local_10);
          std::operator<<(poVar6,": use --help for more information.\n");
          exit(1);
        }
      }
      std::__cxx11::string::operator=(local_18,local_230);
      *local_8 = *local_8 + -1;
      std::__cxx11::string::~string(local_230);
    }
    else if (2 < *local_8) {
      poVar6 = std::operator<<((ostream *)&std::cerr,*(char **)*local_10);
      std::operator<<(poVar6,": more than one file argument not supported\n");
      poVar6 = std::operator<<((ostream *)&std::cerr,*(char **)*local_10);
      std::operator<<(poVar6,": use --help for more information.\n");
      exit(1);
    }
  }
  pFVar9 = _stderr;
  if (1 < (byte)((so.sym_static & 1U) + (so.ldsb & 1U) + (so.ldsbta & 1U) + (so.ldsbad & 1U))) {
    pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                     ,0x2f);
    if (pcVar5 == (char *)0x0) {
      local_3e8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
      ;
    }
    else {
      local_3e8 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                          ,0x2f);
      local_3e8 = local_3e8 + 1;
    }
    fprintf(pFVar9,"%s:%d: ",local_3e8,0x27d);
    fprintf(_stderr,"Assertion `%s\' failed.\n",
            "so.sym_static + so.ldsb + so.ldsbta + so.ldsbad <= 1");
    abort();
  }
  if (((so.ldsbta & 1U) != 0) || ((so.ldsbad & 1U) != 0)) {
    so.ldsb = true;
  }
  if (((so.ldsb & 1U) != 0) && ((so.lazy & 1U) == 0)) {
    pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                     ,0x2f);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
      ;
    }
    else {
      pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                       ,0x2f);
      pcVar5 = pcVar5 + 1;
    }
    fprintf(pFVar9,"%s:%d: ",pcVar5,0x283);
    fprintf(_stderr,"Assertion `%s\' failed.\n","so.lazy");
    abort();
  }
  if (((so.mip_branch & 1U) != 0) && ((so.mip & 1U) == 0)) {
    pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                     ,0x2f);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
      ;
    }
    else {
      pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/core/options.cpp"
                       ,0x2f);
      pcVar5 = pcVar5 + 1;
    }
    fprintf(pFVar9,"%s:%d: ",pcVar5,0x286);
    fprintf(_stderr,"Assertion `%s\' failed.\n","so.mip");
    abort();
  }
  if ((so.vsids & 1U) != 0) {
    (*((engine.branching)->super_Branching)._vptr_Branching[3])(engine.branching,&sat);
  }
  if ((so.learnt_stats_nogood & 1U) != 0) {
    so.learnt_stats = true;
  }
  if ((so.sbps & 1U) != 0) {
    if ((((so.vsids & 1U) == 0) && ((so.toggle_vsids & 1U) == 0)) &&
       (999999999 < so.switch_to_vsids_after)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "WARNING: SBPS value selection must be used with an activity-based search to optimize its efficiency."
                              );
      std::operator<<(poVar6,'\n');
    }
    if ((so.restart_type == NONE) || (so.restart_scale == 0)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "WARNING: SBPS value selection must be used with restarts to optimize its efficiency."
                              );
      std::operator<<(poVar6,'\n');
    }
  }
  return;
}

Assistant:

void parseOptions(int& argc, char**& argv, std::string* fileArg, const std::string& fileExt) {
	int j = 1;
	for (int i = 1; i < argc; i++) {
		CLOParser cop(i, argc, argv);
		int intBuffer;
		bool boolBuffer;
		std::string stringBuffer;
		if (cop.get("-h --help")) {
			printHelp(argc, argv, fileExt);
			std::exit(EXIT_SUCCESS);
		}
		if (cop.get("--help-all")) {
			printLongHelp(argc, argv, fileExt);
			std::exit(EXIT_SUCCESS);
		}
		if (cop.get("-n --n-of-solutions", &intBuffer)) {
			so.nof_solutions = intBuffer;
		} else if (cop.get("-t --time-out", &intBuffer)) {
			// TODO: Remove warning when appropriate
			std::cerr << "WARNING: the --time-out flag has recently been changed."
								<< "The time-out is now provided in milliseconds instead of seconds" << '\n';
			so.time_out = duration(intBuffer);
		} else if (cop.get("-r --rnd-seed", &intBuffer)) {
			so.rnd_seed = intBuffer;
		} else if (cop.getBool("-v --verbose", boolBuffer)) {
			so.verbosity = static_cast<int>(boolBuffer);
		} else if (cop.get("--verbosity", &intBuffer)) {
			so.verbosity = intBuffer;
		} else if (cop.getBool("--print-sol", boolBuffer)) {
			so.print_sol = boolBuffer;
		} else if (cop.get("--restart", &stringBuffer)) {
			if (stringBuffer == "chuffed") {
				so.restart_type = CHUFFED_DEFAULT;
			} else if (stringBuffer == "none") {
				so.restart_type = NONE;
			} else if (stringBuffer == "constant") {
				so.restart_type = CONSTANT;
			} else if (stringBuffer == "linear") {
				so.restart_type = LINEAR;
			} else if (stringBuffer == "luby") {
				so.restart_type = LUBY;
			} else if (stringBuffer == "geometric") {
				so.restart_type = GEOMETRIC;
			} else {
				std::cerr << argv[0] << ": Unknown restart strategy " << stringBuffer
									<< ". Chuffed will use its default strategy.\n";
			}
			so.restart_type_override = false;
		} else if (cop.get("--restart-scale", &intBuffer)) {
			so.restart_scale = static_cast<unsigned int>(intBuffer);
			so.restart_scale_override = false;
		} else if (cop.get("--restart-base", &stringBuffer)) {
			// TODO: Remove warning when appropriate
			std::cerr << "WARNING: the --restart-base flag has recently been changed."
								<< "The old behaviour of \"restart base\" is now implemented by --restart-scale."
								<< '\n';
			so.restart_base = stod(stringBuffer);
			if (so.restart_base < 1.0) {
				CHUFFED_ERROR("Illegal restart base. Restart count will converge to zero.");
			}
			so.restart_base_override = false;
		} else if (cop.getBool("--toggle-vsids", boolBuffer)) {
			so.toggle_vsids = boolBuffer;
		} else if (cop.getBool("--branch-random", boolBuffer)) {
			so.branch_random = boolBuffer;
		} else if (cop.get("--switch-to-vsids-after", &intBuffer)) {
			so.switch_to_vsids_after = intBuffer;
		} else if (cop.get("--sat-polarity", &intBuffer)) {
			so.sat_polarity = intBuffer;
		} else if (cop.getBool("--sbps", boolBuffer)) {
			so.sbps = boolBuffer;
		} else if (cop.getBool("--prop-fifo", boolBuffer)) {
			so.prop_fifo = boolBuffer;
		} else if (cop.getBool("--disj-edge-find", boolBuffer)) {
			so.disj_edge_find = boolBuffer;
		} else if (cop.getBool("--disj-set-bp", boolBuffer)) {
			so.disj_set_bp = boolBuffer;
		} else if (cop.getBool("--cumu-global", boolBuffer)) {
			so.cumu_global = boolBuffer;
		} else if (cop.getBool("--sat-simplify", boolBuffer)) {
			so.sat_simplify = boolBuffer;
		} else if (cop.getBool("--fd-simplify", boolBuffer)) {
			so.fd_simplify = boolBuffer;
		} else if (cop.getBool("--lazy", boolBuffer)) {
			so.lazy = boolBuffer;
		} else if (cop.getBool("--finesse", boolBuffer)) {
			so.finesse = boolBuffer;
		} else if (cop.getBool("--learn", boolBuffer)) {
			so.learn = boolBuffer;
		} else if (cop.getBool("--vsids", boolBuffer)) {
			so.vsids = boolBuffer;
		} else if (cop.getBool("--sort-learnt-level", boolBuffer)) {
			so.sort_learnt_level = boolBuffer;
		} else if (cop.getBool("--one-watch", boolBuffer)) {
			so.one_watch = boolBuffer;
		} else if (cop.getBool("--exclude-introduced", boolBuffer)) {
			so.exclude_introduced = boolBuffer;
		} else if (cop.getBool("--decide-introduced", boolBuffer)) {
			so.decide_introduced = boolBuffer;
		} else if (cop.getBool("--introduced-heuristic", boolBuffer)) {
			so.introduced_heuristic = boolBuffer;
		} else if (cop.getBool("--use-var-is-introduced", boolBuffer)) {
			so.use_var_is_introduced = boolBuffer;
		} else if (cop.getBool("--print-nodes", boolBuffer)) {
			so.print_nodes = boolBuffer;
		} else if (cop.getBool("--print-variable-list", boolBuffer)) {
			so.print_variable_list = boolBuffer;
		} else if (cop.getBool("--print-implications", boolBuffer)) {
			so.print_implications = boolBuffer;
		} else if (cop.getBool("--send-skipped", boolBuffer)) {
			so.send_skipped = boolBuffer;
		} else if (cop.get("--filter-domains", &stringBuffer)) {
			so.filter_domains = stringBuffer;
		} else if (cop.getBool("--learnt-stats", boolBuffer)) {
			so.learnt_stats = boolBuffer;
		} else if (cop.getBool("--learnt-stats-nogood", boolBuffer)) {
			so.learnt_stats_nogood = boolBuffer;
		} else if (cop.getBool("--debug", boolBuffer)) {
			so.debug = boolBuffer;
		} else if (cop.getBool("--exhaustive-activity", boolBuffer)) {
			so.exhaustive_activity = boolBuffer;
		} else if (cop.getBool("--bin-clause-opt", boolBuffer)) {
			so.bin_clause_opt = boolBuffer;
		} else if (cop.getBool("--assump-int", boolBuffer)) {
			so.assump_int = boolBuffer;
		} else if (cop.get("--eager-limit", &intBuffer)) {
			so.eager_limit = intBuffer;
		} else if (cop.get("--sat-var-limit", &intBuffer)) {
			so.sat_var_limit = intBuffer;
		} else if (cop.get("--n-of-learnts", &intBuffer)) {
			so.nof_learnts = intBuffer;
		} else if (cop.get("--learnts-mlimit", &intBuffer)) {
			so.learnts_mlimit = intBuffer;
		} else if (cop.getBool("--lang-ext-linear", boolBuffer)) {
			so.lang_ext_linear = boolBuffer;
		} else if (cop.getBool("--mdd", boolBuffer)) {
			so.mdd = boolBuffer;
		} else if (cop.getBool("--mip", boolBuffer)) {
			so.mip = boolBuffer;
		} else if (cop.getBool("--mip-branch", boolBuffer)) {
			so.mip_branch = boolBuffer;
		} else if (cop.getBool("--sym-static", boolBuffer)) {
			so.sym_static = boolBuffer;
		} else if (cop.getBool("--ldsb", boolBuffer)) {
			so.ldsb = boolBuffer;
		} else if (cop.getBool("--ldsbta", boolBuffer)) {
			so.ldsbta = boolBuffer;
		} else if (cop.getBool("--ldsbad", boolBuffer)) {
			so.ldsbad = boolBuffer;
		} else if (cop.getBool("--well-founded", boolBuffer)) {
			so.well_founded = boolBuffer;
		} else if (cop.get("-a")) {
			so.nof_solutions = 0;
		} else if (cop.get("-f")) {
			so.toggle_vsids = true;
			so.restart_scale = 100;
		} else if (cop.get("-s -S")) {
			so.verbosity = 1;
#ifdef HAS_PROFILER
		} else if (cop.get("--cp-profiler", &stringBuffer)) {
			std::stringstream ss(stringBuffer);
			char sep;
			ss >> so.cpprofiler_id >> sep >> so.cpprofiler_port;
			if (sep == ',' && ss.eof()) {
				so.cpprofiler_enabled = true;
			} else {
				CHUFFED_ERROR("Invalid value for --cp-profiler.");
			}
#endif
		} else if (argv[i][0] == '-') {
			std::cerr << argv[0] << ": unrecognized option " << argv[i] << "\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		} else {
			argv[j++] = argv[i];
		}
	}

	argc = j;

	if (fileArg != nullptr) {
		if (argc == 2) {
			const std::string filename(argv[1]);
			if (!fileExt.empty()) {
				if (filename.size() <= fileExt.size() + 1 ||
						filename.substr(filename.size() - fileExt.size() - 1) != "." + fileExt) {
					std::cerr << argv[0] << ": cannot handle file extension for " << filename << "\n";
					std::cerr << argv[0] << ": use --help for more information.\n";
					std::exit(EXIT_FAILURE);
				}
			}
			*fileArg = filename;
			--argc;
		} else if (argc > 2) {
			std::cerr << argv[0] << ": more than one file argument not supported\n";
			std::cerr << argv[0] << ": use --help for more information.\n";
			std::exit(EXIT_FAILURE);
		}
	}

	rassert(so.sym_static + so.ldsb + so.ldsbta + so.ldsbad <= 1);

	if (so.ldsbta || so.ldsbad) {
		so.ldsb = true;
	}
	if (so.ldsb) {
		rassert(so.lazy);
	}
	if (so.mip_branch) {
		rassert(so.mip);
	}
	if (so.vsids) {
		engine.branching->add(&sat);
	}

	if (so.learnt_stats_nogood) {
		so.learnt_stats = true;
	}

	// Warn user if SBPS is not used with an activity-based search and restarts
	if (so.sbps) {
		if (!(so.vsids || so.toggle_vsids || so.switch_to_vsids_after < 1000000000)) {
			std::cerr << "WARNING: SBPS value selection must be used with an activity-based search to "
									 "optimize its "
									 "efficiency."
								<< '\n';
		}
		if (so.restart_type == NONE || so.restart_scale == 0) {
			std::cerr << "WARNING: SBPS value selection must be used with restarts to optimize its "
									 "efficiency."
								<< '\n';
		}
	}
}